

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

Arg * __thiscall
fmt::internal::FormatterBase::next_arg(Arg *__return_storage_ptr__,FormatterBase *this,char **error)

{
  uint index;
  wchar_t *pwVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  
  index = this->next_arg_index_;
  if ((int)index < 0) {
    *error = "cannot switch from manual to automatic argument indexing";
    wVar2 = L'\0';
    wVar3 = L'\0';
    wVar4 = L'\0';
    wVar5 = L'\0';
    *(undefined8 *)&__return_storage_ptr__->type = 0;
    *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
  }
  else {
    this->next_arg_index_ = index + 1;
    ArgList::operator[](__return_storage_ptr__,&this->args_,index);
    if (__return_storage_ptr__->type != NAMED_ARG) {
      if (__return_storage_ptr__->type != NONE) {
        return __return_storage_ptr__;
      }
      *error = "argument index out of range";
      return __return_storage_ptr__;
    }
    pwVar1 = (__return_storage_ptr__->super_Value).field_0.wstring.value;
    __return_storage_ptr__->type = pwVar1[4];
    wVar2 = *pwVar1;
    wVar3 = pwVar1[1];
    wVar4 = pwVar1[2];
    wVar5 = pwVar1[3];
  }
  (__return_storage_ptr__->super_Value).field_0.int_value = wVar2;
  *(wchar_t *)((long)&(__return_storage_ptr__->super_Value).field_0 + 4) = wVar3;
  *(wchar_t *)((long)&(__return_storage_ptr__->super_Value).field_0 + 8) = wVar4;
  *(wchar_t *)((long)&(__return_storage_ptr__->super_Value).field_0 + 0xc) = wVar5;
  return __return_storage_ptr__;
}

Assistant:

Arg next_arg(const char *&error) {
    if (next_arg_index_ >= 0)
      return do_get_arg(internal::to_unsigned(next_arg_index_++), error);
    error = "cannot switch from manual to automatic argument indexing";
    return Arg();
  }